

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O0

void restartcollection(global_State *g)

{
  global_State *g_local;
  
  g->grayagain = (GCObject *)0x0;
  g->gray = (GCObject *)0x0;
  g->ephemeron = (GCObject *)0x0;
  g->allweak = (GCObject *)0x0;
  g->weak = (GCObject *)0x0;
  if ((g->mainthread->marked & 3) != 0) {
    reallymarkobject(g,(GCObject *)g->mainthread);
  }
  if ((((g->l_registry).tt_ & 0x40U) != 0) && ((((g->l_registry).value_.gc)->marked & 3) != 0)) {
    reallymarkobject(g,(g->l_registry).value_.gc);
  }
  markmt(g);
  markbeingfnz(g);
  return;
}

Assistant:

static void restartcollection (global_State *g) {
  g->gray = g->grayagain = NULL;
  g->weak = g->allweak = g->ephemeron = NULL;
  markobject(g, g->mainthread);
  markvalue(g, &g->l_registry);
  markmt(g);
  markbeingfnz(g);  /* mark any finalizing object left from previous cycle */
}